

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<signed_char>,signed_char,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  idx_t iVar7;
  ulong uVar8;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_a0;
  ValidityMask *local_88;
  unsigned_long *local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_88 = &input->validity;
    local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar8 = 0;
      local_80 = (unsigned_long *)count;
      local_78.sel = (SelectionVector *)aggr_input_data;
      local_78.data = (data_ptr_t)local_88;
      do {
        puVar3 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar6 = (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar6 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar6[uVar8];
        }
        puVar6 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8;
        if (local_80 <=
            local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8) {
          puVar6 = local_80;
        }
        puVar4 = puVar6;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) {
            for (; puVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar6;
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              BitStringAggOperation::
              Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                        ((BitAggState<signed_char> *)state,
                         (char *)((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>
                                        .validity_mask + (long)pdVar1),
                         (AggregateUnaryInput *)&local_78);
            }
          }
          else {
            for (; puVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar6;
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              if ((uVar5 >> ((ulong)(uint)((int)local_78.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar3) & 0x3f) & 1) != 0) {
                BitStringAggOperation::
                Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                          ((BitAggState<signed_char> *)state,
                           (char *)((long)local_78.validity.
                                          super_TemplatedValidityMask<unsigned_long>.validity_mask +
                                   (long)pdVar1),(AggregateUnaryInput *)&local_78);
              }
            }
          }
        }
        local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar6 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      BitStringAggOperation::
      Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                ((BitAggState<signed_char> *)state,(char *)input->data,
                 (AggregateUnaryInput *)&local_78);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    local_a0.input_mask = &local_78.validity;
    local_a0.input_idx = 0;
    local_a0.input = aggr_input_data;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = (local_78.sel)->sel_vector;
        iVar7 = 0;
        do {
          local_a0.input_idx = iVar7;
          if (psVar2 != (sel_t *)0x0) {
            local_a0.input_idx = (idx_t)psVar2[iVar7];
          }
          BitStringAggOperation::
          Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<signed_char> *)state,(char *)(local_78.data + local_a0.input_idx),
                     &local_a0);
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      psVar2 = (local_78.sel)->sel_vector;
      iVar7 = 0;
      do {
        local_a0.input_idx = iVar7;
        if (psVar2 != (sel_t *)0x0) {
          local_a0.input_idx = (idx_t)psVar2[iVar7];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_a0.input_idx >> 6] >> (local_a0.input_idx & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<signed_char> *)state,(char *)(local_78.data + local_a0.input_idx),
                     &local_a0);
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}